

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

QString * __thiscall QMimeXMLProvider::genericIcon(QMimeXMLProvider *this,QString *name)

{
  long lVar1;
  QString *in_RDX;
  QHash<QString,_QMimeTypeXMLData> *in_RSI;
  QMimeTypeXMLData *in_RDI;
  long in_FS_OFFSET;
  QMimeTypeXMLData *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QHash<QString,_QMimeTypeXMLData>::value(in_RSI,in_RDX);
  QString::QString((QString *)this_00,(QString *)in_RDI);
  QMimeTypeXMLData::~QMimeTypeXMLData(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeXMLProvider::genericIcon(const QString &name)
{
    return m_nameMimeTypeMap.value(name).genericIconName;
}